

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O0

int deqp::gles31::Functional::numBasicSubobjects(VarType *type)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  StructType *this;
  StructMember *this_00;
  VarType *pVVar4;
  undefined4 local_28;
  undefined4 local_24;
  int i;
  int result;
  StructType *structType;
  VarType *type_local;
  
  bVar1 = glu::VarType::isBasicType(type);
  if (bVar1) {
    type_local._4_4_ = 1;
  }
  else {
    bVar1 = glu::VarType::isArrayType(type);
    if (bVar1) {
      iVar3 = glu::VarType::getArraySize(type);
      pVVar4 = glu::VarType::getElementType(type);
      iVar2 = numBasicSubobjects(pVVar4);
      type_local._4_4_ = iVar3 * iVar2;
    }
    else {
      bVar1 = glu::VarType::isStructType(type);
      if (bVar1) {
        this = glu::VarType::getStructPtr(type);
        local_24 = 0;
        local_28 = 0;
        while( true ) {
          iVar3 = glu::StructType::getNumMembers(this);
          if (iVar3 <= local_28) break;
          this_00 = glu::StructType::getMember(this,local_28);
          pVVar4 = glu::StructMember::getType(this_00);
          iVar3 = numBasicSubobjects(pVVar4);
          local_24 = iVar3 + local_24;
          local_28 = local_28 + 1;
        }
        type_local._4_4_ = local_24;
      }
      else {
        type_local._4_4_ = -1;
      }
    }
  }
  return type_local._4_4_;
}

Assistant:

static int numBasicSubobjects (const glu::VarType& type)
{
	if (type.isBasicType())
		return 1;
	else if (type.isArrayType())
		return type.getArraySize()*numBasicSubobjects(type.getElementType());
	else if (type.isStructType())
	{
		const glu::StructType&	structType	= *type.getStructPtr();
		int						result		= 0;
		for (int i = 0; i < structType.getNumMembers(); i++)
			result += numBasicSubobjects(structType.getMember(i).getType());
		return result;
	}
	else
	{
		DE_ASSERT(false);
		return -1;
	}
}